

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_5a2f::SolverDpllTriadSimd<2>::SolveSudoku
          (SolverDpllTriadSimd<2> *this,char *input,size_t limit,char *solution,size_t *num_guesses)

{
  char cVar1;
  bool bVar2;
  undefined8 in_RDX;
  long in_RSI;
  char *in_RDI;
  State state;
  bool pencilmark;
  State *in_stack_fffffffffffffdb0;
  State *in_stack_fffffffffffffdd0;
  SolverDpllTriadSimd<2> *in_stack_fffffffffffffdd8;
  State *in_stack_fffffffffffffe08;
  
  *(undefined8 *)(in_RDI + 0x1e0) = in_RDX;
  in_RDI[0x1e8] = '\0';
  in_RDI[0x1e9] = '\0';
  in_RDI[0x1ea] = '\0';
  in_RDI[0x1eb] = '\0';
  in_RDI[0x1ec] = '\0';
  in_RDI[0x1ed] = '\0';
  in_RDI[0x1ee] = '\0';
  in_RDI[0x1ef] = '\0';
  in_RDI[0x1f0] = '\0';
  in_RDI[0x1f1] = '\0';
  in_RDI[0x1f2] = '\0';
  in_RDI[499] = '\0';
  in_RDI[500] = '\0';
  in_RDI[0x1f5] = '\0';
  in_RDI[0x1f6] = '\0';
  in_RDI[0x1f7] = '\0';
  cVar1 = *(char *)(in_RSI + 0x51);
  State::State(in_stack_fffffffffffffe08);
  if (cVar1 < '.') {
    bVar2 = InitVanillaByBand(in_RDI,in_stack_fffffffffffffdb0);
  }
  else {
    bVar2 = InitPencilmarkByBox((char *)state.bands[1][2].eliminations.vec[1],
                                (State *)state.bands[1][2].eliminations.vec[0]);
  }
  if (bVar2) {
    CountSolutionsConsistentWithPartialAssignment
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  }
  return *(size_t *)(in_RDI + 0x1e8);
}

Assistant:

size_t SolveSudoku(const char *input, size_t limit,
                       char *solution, size_t *num_guesses) {
        limit_ = limit;
        num_solutions_ = 0;
        num_guesses_ = 0;
        bool pencilmark = input[81] >= '.';

        State state;
        if (pencilmark ? InitPencilmarkByBox(input, state) : InitVanillaByBand(input, state)) {
            CountSolutionsConsistentWithPartialAssignment(state);
            if (solution_mode == 1) ExtractSolution(solution_, solution);
        }
        if (solution_mode != 2) *num_guesses = num_guesses_;
        return num_solutions_;
    }